

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::MmapInputFile::MmapInputFile(MmapInputFile *this,string_view filename,string_view data)

{
  InputFile::InputFile(&this->super_InputFile,filename);
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR_TryOpen_005fd1f0;
  (this->super_InputFile).data_._M_len = data._M_len;
  (this->super_InputFile).data_._M_str = data._M_str;
  return;
}

Assistant:

MmapInputFile::MmapInputFile(string_view filename, string_view data)
    : InputFile(filename) {
  data_ = data;
}